

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

int gfield::legendre<13>(bigint<13> *x)

{
  int iVar1;
  bigint<13> *pbVar2;
  gfield L;
  bigint<1> local_40;
  gfint local_38;
  
  if (legendre<13>(bigint<int>const&)::Psub1div2 == '\0') {
    iVar1 = __cxa_guard_acquire(&legendre<13>(bigint<int>const&)::Psub1div2);
    if (iVar1 != 0) {
      local_38.digits[6] = P.super_gfint.digits[6];
      local_38.digits[7] = P.super_gfint.digits[7];
      local_38.digits[8] = P.super_gfint.digits[8];
      local_38.digits[9] = P.super_gfint.digits[9];
      local_38.digits[10] = P.super_gfint.digits[10];
      local_38.digits[0xb] = P.super_gfint.digits[0xb];
      local_38.digits[0xc] = P.super_gfint.digits[0xc];
      local_38.len = P.super_gfint.len;
      local_38.digits[0] = P.super_gfint.digits[0];
      local_38.digits[1] = P.super_gfint.digits[1];
      local_38.digits[2] = P.super_gfint.digits[2];
      local_38.digits[3] = P.super_gfint.digits[3];
      local_38.digits[4] = P.super_gfint.digits[4];
      local_38.digits[5] = P.super_gfint.digits[5];
      local_40.digits[0] = 1;
      local_40.len = 1;
      pbVar2 = bigint<13>::sub<13,1>(&local_38,&local_38,&local_40);
      pbVar2 = bigint<13>::rshift<13>(pbVar2,pbVar2,1);
      legendre<13>::Psub1div2.len = pbVar2->len;
      legendre<13>::Psub1div2.digits._0_4_ = *(undefined4 *)pbVar2->digits;
      legendre<13>::Psub1div2.digits._4_4_ = *(undefined4 *)(pbVar2->digits + 2);
      legendre<13>::Psub1div2.digits._8_4_ = *(undefined4 *)(pbVar2->digits + 4);
      legendre<13>::Psub1div2.digits._12_4_ = *(undefined4 *)(pbVar2->digits + 6);
      legendre<13>::Psub1div2.digits._16_4_ = *(undefined4 *)(pbVar2->digits + 8);
      legendre<13>::Psub1div2.digits._20_4_ = *(undefined4 *)(pbVar2->digits + 10);
      legendre<13>::Psub1div2._28_4_ = *(undefined4 *)(pbVar2->digits + 0xc);
      __cxa_guard_release(&legendre<13>(bigint<int>const&)::Psub1div2);
    }
  }
  pow<13,13>((gfield *)&local_38,x,&legendre<13>::Psub1div2);
  iVar1 = (uint)(local_38.len == 1) * 2 + -1;
  if (local_38.len == 0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int legendre(const bigint<X_DIGITS> &x)
    {
        static const gfint Psub1div2(gfint(P).sub(bigint<1>(1)).rshift(1));
        gfield L;
        L.pow(x, Psub1div2);
        if(!L.len) return 0;
        if(L.len==1) return 1;
        return -1;
    }